

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int defragmentPage(MemPage *pPage)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  u8 *puVar4;
  u16 uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  u8 *puVar12;
  MemPage *in_RDI;
  int x;
  u8 *pAddr;
  int iCellLast;
  int iCellFirst;
  uchar *src;
  uchar *temp;
  uchar *data;
  int nCell;
  int cbrk;
  int cellOffset;
  int usableSize;
  int size;
  int hdr;
  int pc;
  int i;
  u8 *local_48;
  u8 *local_40;
  uint local_2c;
  int local_14;
  int local_4;
  
  local_40 = (u8 *)0x0;
  puVar4 = in_RDI->aData;
  uVar6 = (uint)in_RDI->hdrOffset;
  uVar1 = in_RDI->cellOffset;
  uVar2 = in_RDI->nCell;
  uVar3 = in_RDI->pBt->usableSize;
  uVar7 = (uint)uVar1 + (uint)uVar2 * 2;
  local_14 = 0;
  local_48 = puVar4;
  local_2c = uVar3;
  do {
    if ((int)(uint)uVar2 <= local_14) {
      puVar4[(int)(uVar6 + 5)] = (u8)(local_2c >> 8);
      puVar4[(long)(int)(uVar6 + 5) + 1] = (u8)local_2c;
      puVar4[(int)(uVar6 + 1)] = '\0';
      puVar4[(int)(uVar6 + 2)] = '\0';
      puVar4[(int)(uVar6 + 7)] = '\0';
      memset(puVar4 + (int)uVar7,0,(long)(int)(local_2c - uVar7));
      if (local_2c - uVar7 == (uint)in_RDI->nFree) {
        local_4 = 0;
      }
      else {
        local_4 = sqlite3CorruptError(0);
      }
      return local_4;
    }
    puVar12 = puVar4 + (int)((uint)uVar1 + local_14 * 2);
    uVar8 = (uint)CONCAT11(*puVar12,puVar12[1]);
    if ((uVar8 < uVar7) || ((int)(uVar3 - 4) < (int)uVar8)) {
      iVar9 = sqlite3CorruptError(0);
      return iVar9;
    }
    uVar5 = cellSizePtr(in_RDI,local_48 + (int)uVar8);
    uVar10 = (uint)uVar5;
    local_2c = local_2c - uVar10;
    if (((int)local_2c < (int)uVar7) || ((int)uVar3 < (int)(uVar8 + uVar10))) {
      iVar9 = sqlite3CorruptError(0);
      return iVar9;
    }
    *puVar12 = (u8)(local_2c >> 8);
    puVar12[1] = (u8)local_2c;
    if (local_40 == (u8 *)0x0) {
      if (local_2c != uVar8) {
        local_48 = (u8 *)sqlite3PagerTempSpace(in_RDI->pBt->pPager);
        uVar11 = (uint)CONCAT11(puVar4[(int)(uVar6 + 5)],puVar4[(long)(int)(uVar6 + 5) + 1]);
        memcpy(local_48 + (int)uVar11,puVar4 + (int)uVar11,(long)(int)((local_2c + uVar10) - uVar11)
              );
        local_40 = local_48;
        goto LAB_001530c0;
      }
    }
    else {
LAB_001530c0:
      memcpy(puVar4 + (int)local_2c,local_48 + (int)uVar8,(long)(int)uVar10);
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

static int defragmentPage(MemPage *pPage){
  int i;                     /* Loop counter */
  int pc;                    /* Address of the i-th cell */
  int hdr;                   /* Offset to the page header */
  int size;                  /* Size of a cell */
  int usableSize;            /* Number of usable bytes on a page */
  int cellOffset;            /* Offset to the cell pointer array */
  int cbrk;                  /* Offset to the cell content area */
  int nCell;                 /* Number of cells on the page */
  unsigned char *data;       /* The page data */
  unsigned char *temp;       /* Temp area for cell content */
  unsigned char *src;        /* Source of content */
  int iCellFirst;            /* First allowable cell index */
  int iCellLast;             /* Last possible cell index */


  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( pPage->pBt!=0 );
  assert( pPage->pBt->usableSize <= SQLITE_MAX_PAGE_SIZE );
  assert( pPage->nOverflow==0 );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  temp = 0;
  src = data = pPage->aData;
  hdr = pPage->hdrOffset;
  cellOffset = pPage->cellOffset;
  nCell = pPage->nCell;
  assert( nCell==get2byte(&data[hdr+3]) );
  usableSize = pPage->pBt->usableSize;
  cbrk = usableSize;
  iCellFirst = cellOffset + 2*nCell;
  iCellLast = usableSize - 4;
  for(i=0; i<nCell; i++){
    u8 *pAddr;     /* The i-th cell pointer */
    pAddr = &data[cellOffset + i*2];
    pc = get2byte(pAddr);
    testcase( pc==iCellFirst );
    testcase( pc==iCellLast );
#if !defined(SQLITE_ENABLE_OVERSIZE_CELL_CHECK)
    /* These conditions have already been verified in btreeInitPage()
    ** if SQLITE_ENABLE_OVERSIZE_CELL_CHECK is defined 
    */
    if( pc<iCellFirst || pc>iCellLast ){
      return SQLITE_CORRUPT_BKPT;
    }
#endif
    assert( pc>=iCellFirst && pc<=iCellLast );
    size = cellSizePtr(pPage, &src[pc]);
    cbrk -= size;
#if defined(SQLITE_ENABLE_OVERSIZE_CELL_CHECK)
    if( cbrk<iCellFirst ){
      return SQLITE_CORRUPT_BKPT;
    }
#else
    if( cbrk<iCellFirst || pc+size>usableSize ){
      return SQLITE_CORRUPT_BKPT;
    }
#endif
    assert( cbrk+size<=usableSize && cbrk>=iCellFirst );
    testcase( cbrk+size==usableSize );
    testcase( pc+size==usableSize );
    put2byte(pAddr, cbrk);
    if( temp==0 ){
      int x;
      if( cbrk==pc ) continue;
      temp = sqlite3PagerTempSpace(pPage->pBt->pPager);
      x = get2byte(&data[hdr+5]);
      memcpy(&temp[x], &data[x], (cbrk+size) - x);
      src = temp;
    }
    memcpy(&data[cbrk], &src[pc], size);
  }
  assert( cbrk>=iCellFirst );
  put2byte(&data[hdr+5], cbrk);
  data[hdr+1] = 0;
  data[hdr+2] = 0;
  data[hdr+7] = 0;
  memset(&data[iCellFirst], 0, cbrk-iCellFirst);
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  if( cbrk-iCellFirst!=pPage->nFree ){
    return SQLITE_CORRUPT_BKPT;
  }
  return SQLITE_OK;
}